

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O0

char * __thiscall mserialize::detail::write_integer_as_hex<short>(detail *this,short v,char *end)

{
  undefined6 in_register_00000032;
  char digits [17];
  char *end_local;
  short v_local;
  
  v_local = (short)this;
  end_local = (char *)CONCAT62(in_register_00000032,v);
  builtin_strncpy(digits,"0123456789ABCDEF",0x11);
  if (v_local == 0) {
    end_local[-1] = '0';
    end_local = end_local + -1;
  }
  else if (v_local < 1) {
    for (; v_local != 0; v_local = v_local / 0x10) {
      end_local[-1] = digits[-((int)v_local % 0x10)];
      end_local = end_local + -1;
    }
    end_local[-1] = '-';
    end_local = end_local + -1;
  }
  else {
    for (; v_local != 0; v_local = v_local / 0x10) {
      end_local[-1] = digits[(int)v_local % 0x10];
      end_local = end_local + -1;
    }
  }
  return end_local;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}